

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O0

string_view gmlc::utilities::string_viewOps::trim(string_view input,string_view trimCharacters)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  size_type sVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_RCX;
  basic_string_view<char,_std::char_traits<char>_> *in_RDX;
  string_view sVar2;
  size_type strEnd;
  size_type strStart;
  size_type in_stack_ffffffffffffff98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> *__pos;
  basic_string_view<char,_std::char_traits<char>_> *this;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  __str._M_str = in_stack_ffffffffffffffb0;
  __str._M_len = in_stack_ffffffffffffffa8;
  __pos = in_RDX;
  this = in_RCX;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                    (in_stack_ffffffffffffffa0,__str,in_stack_ffffffffffffff98);
  if (sVar1 == 0xffffffffffffffff) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_10);
  }
  else {
    __str_00._M_str = in_stack_ffffffffffffffb0;
    __str_00._M_len = (size_t)in_RCX;
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                      (in_RDX,__str_00,in_stack_ffffffffffffff98);
    local_10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (this,(size_type)__pos,sVar1);
  }
  sVar2._M_len = local_10._M_len;
  sVar2._M_str = local_10._M_str;
  return sVar2;
}

Assistant:

std::string_view trim(std::string_view input, std::string_view trimCharacters)
{
    const auto strStart = input.find_first_not_of(trimCharacters);
    if (strStart == std::string::npos) {
        return {};  // no content
    }

    const auto strEnd = input.find_last_not_of(trimCharacters);

    return input.substr(strStart, strEnd - strStart + 1);
}